

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O3

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  ulong *puVar1;
  pointer ppIVar2;
  Import *pIVar3;
  pointer pcVar4;
  pointer ppEVar5;
  Export *pEVar6;
  pointer pTVar7;
  pointer pTVar8;
  Index IVar9;
  Index IVar10;
  Index IVar11;
  Index IVar12;
  Result RVar13;
  long *plVar14;
  Func *pFVar15;
  pointer ppGVar16;
  pointer ppTVar17;
  pointer ppFVar18;
  pointer pbVar19;
  pointer ppTVar20;
  pointer ppMVar21;
  pointer ppEVar22;
  pointer ppDVar23;
  pointer ppEVar24;
  pointer ppGVar25;
  pointer ppTVar26;
  pointer pbVar27;
  pointer ppTVar28;
  pointer ppMVar29;
  pointer ppEVar30;
  pointer ppDVar31;
  pointer ppEVar32;
  char *prefix;
  pointer ppIVar33;
  ulong uVar34;
  ulong uVar35;
  pointer ppEVar36;
  BindingHash *bindings;
  long lVar37;
  __string_type __str;
  NameGenerator generator;
  string new_name;
  undefined1 local_f8 [40];
  NameGenerator local_d0;
  string local_50;
  
  local_d0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_001a83e0;
  local_d0.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor(&local_d0.visitor_,(Delegate *)&local_d0);
  local_d0.num_global_imports_ = 0;
  local_d0.num_event_imports_ = 0;
  local_d0.label_count_ = 0;
  local_d0.num_func_imports_ = 0;
  local_d0.num_table_imports_ = 0;
  local_d0.num_memory_imports_ = 0;
  ppIVar33 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_d0.module_ = module;
  local_d0.opts_ = opts;
  if (ppIVar33 != ppIVar2) {
    do {
      pIVar3 = *ppIVar33;
      IVar10 = local_d0.num_global_imports_;
      IVar11 = local_d0.num_event_imports_;
      IVar12 = local_d0.num_table_imports_;
      IVar9 = local_d0.num_memory_imports_;
      switch(pIVar3->kind_) {
      case First:
        bindings = &(local_d0.module_)->func_bindings;
        IVar12 = local_d0.num_func_imports_;
        local_d0.num_func_imports_ = local_d0.num_func_imports_ + 1;
        break;
      case Table:
        bindings = &(local_d0.module_)->table_bindings;
        local_d0.num_table_imports_ = local_d0.num_table_imports_ + 1;
        break;
      case Memory:
        bindings = &(local_d0.module_)->memory_bindings;
        local_d0.num_memory_imports_ = local_d0.num_memory_imports_ + 1;
        IVar12 = IVar9;
        break;
      case Global:
        bindings = &(local_d0.module_)->global_bindings;
        local_d0.num_global_imports_ = local_d0.num_global_imports_ + 1;
        IVar12 = IVar10;
        break;
      case Event:
        bindings = &(local_d0.module_)->event_bindings;
        local_d0.num_event_imports_ = local_d0.num_event_imports_ + 1;
        IVar12 = IVar11;
        break;
      default:
        goto switchD_0014d526_default;
      }
      if (IVar12 == 0xffffffff) {
        __assert_fail("index != kInvalidIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/generate-names.cc"
                      ,0x14a,
                      "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
      }
      local_f8._0_8_ = local_f8 + 0x10;
      pcVar4 = (pIVar3->module_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar4,pcVar4 + (pIVar3->module_name)._M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)local_f8,local_f8._8_8_,0,'\x01');
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_f8,(ulong)(pIVar3->field_name)._M_dataplus._M_p);
      puVar1 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_50.field_2._M_allocated_capacity = *puVar1;
        local_50.field_2._8_8_ = plVar14[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *puVar1;
        local_50._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_50._M_string_length = plVar14[1];
      *plVar14 = (long)puVar1;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      anon_unknown_19::NameGenerator::MaybeUseAndBindName
                (&local_d0,bindings,local_50._M_dataplus._M_p,IVar12,(string *)(pIVar3 + 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
switchD_0014d526_default:
      ppIVar33 = ppIVar33 + 1;
    } while (ppIVar33 != ppIVar2);
  }
  ppEVar5 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar36 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar36 != ppEVar5; ppEVar36 = ppEVar36 + 1) {
    pEVar6 = *ppEVar36;
    switch(pEVar6->kind) {
    case First:
      pFVar15 = Module::GetFunc(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetFuncIndex(local_d0.module_,&pEVar6->var);
        lVar37 = 0x1b0;
LAB_0014d7f1:
        anon_unknown_19::NameGenerator::MaybeUseAndBindName
                  (&local_d0,
                   (BindingHash *)((long)&((local_d0.module_)->loc).filename.data_ + lVar37),
                   (pEVar6->name)._M_dataplus._M_p,IVar12,&pFVar15->name);
      }
      break;
    case Table:
      pFVar15 = (Func *)Module::GetTable(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetTableIndex(local_d0.module_,&pEVar6->var);
        lVar37 = 0x290;
        goto LAB_0014d7f1;
      }
      break;
    case Memory:
      pFVar15 = (Func *)Module::GetMemory(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetMemoryIndex(local_d0.module_,&pEVar6->var);
        lVar37 = 0x2c8;
        goto LAB_0014d7f1;
      }
      break;
    case Global:
      pFVar15 = (Func *)Module::GetGlobal(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetGlobalIndex(local_d0.module_,&pEVar6->var);
        lVar37 = 0x1e8;
        goto LAB_0014d7f1;
      }
      break;
    case Event:
      pFVar15 = (Func *)Module::GetEvent(local_d0.module_,&pEVar6->var);
      if (pFVar15 != (Func *)0x0) {
        IVar12 = Module::GetEventIndex(local_d0.module_,&pEVar6->var);
        lVar37 = 0x178;
        goto LAB_0014d7f1;
      }
    }
  }
  ppGVar16 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar25 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar25 != ppGVar16) {
    uVar34 = 0;
    do {
      if ((ppGVar16[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->global_bindings,"g",(Index)uVar34,
                   &ppGVar16[uVar34]->name);
        ppGVar16 = (module->globals).
                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppGVar25 = (module->globals).
                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppGVar25 - (long)ppGVar16 >> 3));
  }
  ppTVar17 = (module->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar26 = (module->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar26 != ppTVar17) {
    uVar34 = 0;
    do {
      if ((ppTVar17[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->type_bindings,"t",(Index)uVar34,
                   &ppTVar17[uVar34]->name);
        ppTVar17 = (module->types).
                   super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppTVar26 = (module->types).
                   super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppTVar26 - (long)ppTVar17 >> 3));
  }
  ppFVar18 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar18) {
    uVar34 = 0;
    do {
      pFVar15 = ppFVar18[uVar34];
      if ((pFVar15->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->func_bindings,"f",(Index)uVar34,&pFVar15->name);
      }
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_f8._16_8_ = (pointer)0x0;
      pTVar7 = (pFVar15->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar8 = (pFVar15->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      IVar12 = LocalTypes::size(&pFVar15->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar7 - (long)pTVar8) >> 2) + IVar12),
                 &pFVar15->bindings,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8);
      if (local_f8._8_8_ != local_f8._0_8_) {
        lVar37 = 0;
        uVar35 = 0;
        pbVar19 = (pointer)local_f8._0_8_;
        pbVar27 = (pointer)local_f8._8_8_;
        do {
          if (*(long *)((long)&pbVar19->_M_string_length + lVar37) == 0) {
            prefix = "p";
            if (((ulong)((long)(pFVar15->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar15->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= uVar35) {
              prefix = "l";
            }
            local_50._M_string_length = 0;
            local_50.field_2._M_allocated_capacity =
                 local_50.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            anon_unknown_19::NameGenerator::GenerateAndBindName
                      (&local_d0,&pFVar15->bindings,prefix,(Index)uVar35,&local_50);
            std::__cxx11::string::_M_assign
                      ((string *)((long)&((_Alloc_hider *)local_f8._0_8_)->_M_p + lVar37));
            pbVar19 = (pointer)local_f8._0_8_;
            pbVar27 = (pointer)local_f8._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
              pbVar19 = (pointer)local_f8._0_8_;
              pbVar27 = (pointer)local_f8._8_8_;
            }
          }
          uVar35 = uVar35 + 1;
          lVar37 = lVar37 + 0x20;
        } while (uVar35 < (ulong)((long)pbVar27 - (long)pbVar19 >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      local_d0._96_8_ = local_d0._96_8_ & 0xffffffff00000000;
      RVar13 = ExprVisitor::VisitFunc(&local_d0.visitor_,pFVar15);
      if (RVar13.enum_ == Error) break;
      uVar34 = (ulong)((Index)uVar34 + 1);
      ppFVar18 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar34 < (ulong)((long)(module->funcs).
                                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar18 >> 3)
            );
  }
  ppTVar20 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar28 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar28 != ppTVar20) {
    uVar34 = 0;
    do {
      if ((ppTVar20[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->table_bindings,"T",(Index)uVar34,
                   &ppTVar20[uVar34]->name);
        ppTVar20 = (module->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppTVar28 = (module->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppTVar28 - (long)ppTVar20 >> 3));
  }
  ppMVar21 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppMVar29 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar29 != ppMVar21) {
    uVar34 = 0;
    do {
      if ((ppMVar21[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->memory_bindings,"M",(Index)uVar34,
                   &ppMVar21[uVar34]->name);
        ppMVar21 = (module->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppMVar29 = (module->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppMVar29 - (long)ppMVar21 >> 3));
  }
  ppEVar22 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar30 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar30 != ppEVar22) {
    uVar34 = 0;
    do {
      if ((ppEVar22[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->event_bindings,"e",(Index)uVar34,
                   &ppEVar22[uVar34]->name);
        ppEVar22 = (module->events).
                   super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppEVar30 = (module->events).
                   super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppEVar30 - (long)ppEVar22 >> 3));
  }
  ppDVar23 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar31 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppDVar31 != ppDVar23) {
    uVar34 = 0;
    do {
      if ((ppDVar23[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->data_segment_bindings,"d",(Index)uVar34,
                   &ppDVar23[uVar34]->name);
        ppDVar23 = (module->data_segments).
                   super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppDVar31 = (module->data_segments).
                   super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppDVar31 - (long)ppDVar23 >> 3));
  }
  ppEVar24 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar32 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppEVar32 != ppEVar24) {
    uVar34 = 0;
    do {
      if ((ppEVar24[uVar34]->name)._M_string_length == 0) {
        anon_unknown_19::NameGenerator::GenerateAndBindName
                  (&local_d0,&(local_d0.module_)->elem_segment_bindings,"e",(Index)uVar34,
                   &ppEVar24[uVar34]->name);
        ppEVar24 = (module->elem_segments).
                   super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar32 = (module->elem_segments).
                   super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar34 = (ulong)((Index)uVar34 + 1);
    } while (uVar34 < (ulong)((long)ppEVar32 - (long)ppEVar24 >> 3));
  }
  local_d0.module_ = (Module *)0x0;
  local_d0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_001a83e0;
  if (local_d0.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}